

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

bool __thiscall R1Interval::Intersects(R1Interval *this,R1Interval *y)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  
  dVar1 = (this->bounds_).c_[0];
  dVar2 = (y->bounds_).c_[0];
  if (dVar1 <= dVar2) {
    if ((this->bounds_).c_[1] < dVar2) {
      return false;
    }
    bVar3 = (y->bounds_).c_[1] < dVar2;
  }
  else {
    if ((y->bounds_).c_[1] < dVar1) {
      return false;
    }
    bVar3 = (this->bounds_).c_[1] < dVar1;
  }
  return !bVar3;
}

Assistant:

T operator[](int b) const {
    S2_DCHECK_GE(b, 0);
    S2_DCHECK_LT(b, SIZE);
    return static_cast<const D&>(*this).Data()[b];
  }